

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFileDB.cpp
# Opt level: O2

void __thiscall ObjectFileDB::find_code(ObjectFileDB *this)

{
  LinkedObjectFile *this_00;
  key_type *pkVar1;
  pointer pOVar2;
  double dVar3;
  bool bVar4;
  mapped_type *pmVar5;
  Config *pCVar6;
  pointer pOVar7;
  key_type *__k;
  Stats combined_stats;
  Timer timer;
  string local_50;
  
  puts("- Finding code in object files...");
  combined_stats.data_bytes = 0;
  combined_stats.code_bytes = 0;
  combined_stats.function_count = 0;
  combined_stats.decoded_ops = 0;
  combined_stats.v3_link_bytes = 0;
  combined_stats.v3_symbol_count = 0;
  combined_stats.v3_symbol_link_offset = 0;
  combined_stats.v3_symbol_link_word = 0;
  combined_stats.v3_pointers = 0;
  combined_stats.v3_split_pointers = 0;
  combined_stats.v3_word_pointers = 0;
  combined_stats.v3_pointer_seeks = 0;
  combined_stats.total_v2_link_bytes = 0;
  combined_stats.total_v2_symbol_links = 0;
  combined_stats.total_v2_symbol_count = 0;
  combined_stats.v3_code_bytes = 0;
  combined_stats.total_code_bytes = 0;
  combined_stats.total_v2_code_bytes = 0;
  combined_stats.total_v2_pointers = 0;
  combined_stats.total_v2_pointer_seeks = 0;
  combined_stats.n_fp_reg_use = 0;
  combined_stats.n_fp_reg_use_resolved = 0;
  Timer::Timer(&timer);
  pkVar1 = (this->obj_file_order).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __k = (this->obj_file_order).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  if ((this->obj_files_by_name)._M_h._M_element_count != (long)pkVar1 - (long)__k >> 5) {
    __assert_fail("obj_files_by_name.size() == obj_file_order.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.h"
                  ,0x3e,
                  "void ObjectFileDB::for_each_obj(Func) [Func = (lambda at /workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp:331:16)]"
                 );
  }
  do {
    if (__k == pkVar1) {
      puts("Found code:");
      printf(" code %.3f MB\n",
             SUB84((double)((float)((ulong)combined_stats._64_8_ >> 0x20) * 9.536743e-07),0));
      printf(" data %.3f MB\n",
             SUB84((double)((float)(combined_stats._64_8_ & 0xffffffff) * 9.536743e-07),0));
      printf(" functions: %d\n",combined_stats._72_8_ & 0xffffffff);
      printf(" fp uses resolved: %d / %d (%.3f %%)\n",
             SUB84((double)(((float)((ulong)combined_stats._80_8_ >> 0x20) * 100.0) /
                           (float)(combined_stats._80_8_ & 0xffffffff)),0));
      printf(" decoded %d / %d (%.3f %%)\n",
             SUB84((double)(((float)((ulong)combined_stats._72_8_ >> 0x20) * 100.0) /
                           (float)(combined_stats.code_bytes >> 2)),0));
      dVar3 = Timer::getMs(&timer);
      printf(" total %.3f ms\n",SUB84(dVar3,0));
      putchar(10);
      return;
    }
    pmVar5 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)this,__k);
    pOVar2 = (pmVar5->super__Vector_base<ObjectFileData,_std::allocator<ObjectFileData>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pOVar7 = (pmVar5->super__Vector_base<ObjectFileData,_std::allocator<ObjectFileData>_>).
                  _M_impl.super__Vector_impl_data._M_start; pOVar7 != pOVar2; pOVar7 = pOVar7 + 1) {
      this_00 = &pOVar7->linked_data;
      LinkedObjectFile::find_code(this_00);
      LinkedObjectFile::find_functions(this_00);
      LinkedObjectFile::disassemble_functions(this_00);
      pCVar6 = get_config();
      if (pCVar6->game_version == 1) {
LAB_001308c3:
        LinkedObjectFile::process_fp_relative_links(this_00);
      }
      else {
        ObjectFileRecord::to_unique_name_abi_cxx11_(&local_50,&pOVar7->record);
        bVar4 = std::operator!=(&local_50,"effect-control-v0");
        std::__cxx11::string::~string((string *)&local_50);
        if (bVar4) goto LAB_001308c3;
        ObjectFileRecord::to_unique_name_abi_cxx11_(&local_50,&pOVar7->record);
        printf("skipping process_fp_relative_links in %s\n",local_50._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_50);
      }
      if ((pOVar7->linked_data).stats.decoded_ops < (pOVar7->linked_data).stats.code_bytes >> 2) {
        ObjectFileRecord::to_unique_name_abi_cxx11_(&local_50,&pOVar7->record);
        printf("Failed to decode all in %s (%d / %d)\n",local_50._M_dataplus._M_p,
               (ulong)(pOVar7->linked_data).stats.decoded_ops,
               (ulong)((pOVar7->linked_data).stats.code_bytes >> 2));
        std::__cxx11::string::~string((string *)&local_50);
      }
      LinkedObjectFile::Stats::add(&combined_stats,&this_00->stats);
    }
    __k = __k + 1;
  } while( true );
}

Assistant:

void ObjectFileDB::find_code() {
  printf("- Finding code in object files...\n");
  LinkedObjectFile::Stats combined_stats;
  Timer timer;

  for_each_obj([&](ObjectFileData& obj) {
    //      printf("fc %s\n", obj.record.to_unique_name().c_str());
    obj.linked_data.find_code();
    obj.linked_data.find_functions();
    obj.linked_data.disassemble_functions();

    if (get_config().game_version == 1 || obj.record.to_unique_name() != "effect-control-v0") {
      obj.linked_data.process_fp_relative_links();
    } else {
      printf("skipping process_fp_relative_links in %s\n", obj.record.to_unique_name().c_str());
    }

    auto& obj_stats = obj.linked_data.stats;
    if (obj_stats.code_bytes / 4 > obj_stats.decoded_ops) {
      printf("Failed to decode all in %s (%d / %d)\n", obj.record.to_unique_name().c_str(),
             obj_stats.decoded_ops, obj_stats.code_bytes / 4);
    }
    combined_stats.add(obj.linked_data.stats);
  });

  printf("Found code:\n");
  printf(" code %.3f MB\n", combined_stats.code_bytes / (float)(1 << 20));
  printf(" data %.3f MB\n", combined_stats.data_bytes / (float)(1 << 20));
  printf(" functions: %d\n", combined_stats.function_count);
  printf(" fp uses resolved: %d / %d (%.3f %%)\n", combined_stats.n_fp_reg_use_resolved,
         combined_stats.n_fp_reg_use,
         100.f * (float)combined_stats.n_fp_reg_use_resolved / combined_stats.n_fp_reg_use);
  auto total_ops = combined_stats.code_bytes / 4;
  printf(" decoded %d / %d (%.3f %%)\n", combined_stats.decoded_ops, total_ops,
         100.f * (float)combined_stats.decoded_ops / total_ops);
  printf(" total %.3f ms\n", timer.getMs());
  printf("\n");
}